

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O0

Vector * BiCGIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
                 double OmegaPrecond)

{
  Boolean BVar1;
  LASErrIdType LVar2;
  size_t Dim_00;
  Vector *pVVar3;
  QMatrix *pQVar4;
  double bNorm_00;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 local_1c0 [8];
  Vector z_;
  Vector z;
  Vector q;
  Vector p_;
  Vector p;
  Vector r_;
  Vector r;
  size_t Dim;
  double bNorm;
  double RhoOld;
  double Rho;
  double Beta;
  double Alpha;
  int Iter;
  double OmegaPrecond_local;
  PrecondProcType PrecondProc_local;
  int MaxIter_local;
  Vector *b_local;
  Vector *x_local;
  QMatrix *A_local;
  
  bNorm = 0.0;
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim_00 = Q_GetDim(A);
  V_Constr((Vector *)&r_.Cmp,"r",Dim_00,Normal,True);
  V_Constr((Vector *)&p.Cmp,"r_",Dim_00,Normal,True);
  V_Constr((Vector *)&p_.Cmp,"p",Dim_00,Normal,True);
  V_Constr((Vector *)&q.Cmp,"p_",Dim_00,Normal,True);
  V_Constr((Vector *)&z.Cmp,"q",Dim_00,Normal,True);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar1 = Q_KerDefined(A), BVar1 != False)) {
    V_Constr((Vector *)&z_.Cmp,"z",Dim_00,Normal,True);
    V_Constr((Vector *)local_1c0,"z_",Dim_00,Normal,True);
  }
  LVar2 = LASResult();
  if (LVar2 == LASOK) {
    bNorm_00 = l2Norm_V(b);
    Alpha._4_4_ = 0;
    dVar5 = l1Norm_V(x);
    auVar7._8_4_ = (int)(Dim_00 >> 0x20);
    auVar7._0_8_ = Dim_00;
    auVar7._12_4_ = 0x45300000;
    if (ABS(dVar5 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim_00) - 4503599627370496.0))) <
        2.2250738585072014e-307) {
      Asgn_VV((Vector *)&r_.Cmp,b);
    }
    else {
      BVar1 = Q_KerDefined(A);
      if (BVar1 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar3 = Mul_QV(A,x);
      pVVar3 = Sub_VV(b,pVVar3);
      Asgn_VV((Vector *)&r_.Cmp,pVVar3);
    }
    if ((PrecondProc == (PrecondProcType)0x0) && (BVar1 = Q_KerDefined(A), BVar1 == False)) {
      Asgn_VV((Vector *)&p.Cmp,(Vector *)&r_.Cmp);
      while( true ) {
        dVar5 = l2Norm_V((Vector *)&r_.Cmp);
        BVar1 = RTCResult(Alpha._4_4_,dVar5,bNorm_00,BiCGIterId);
        if (BVar1 != False || MaxIter <= Alpha._4_4_) break;
        Alpha._4_4_ = Alpha._4_4_ + 1;
        dVar5 = Mul_VV((Vector *)&r_.Cmp,(Vector *)&p.Cmp);
        if (ABS(dVar5) < 2.2250738585072014e-307) {
          LASError(LASBreakdownErr,"BiCGIter","Rho",(char *)0x0,(char *)0x0);
          break;
        }
        if (Alpha._4_4_ == 1) {
          Asgn_VV((Vector *)&p_.Cmp,(Vector *)&r_.Cmp);
          Asgn_VV((Vector *)&q.Cmp,(Vector *)&p.Cmp);
        }
        else {
          pVVar3 = Mul_SV(dVar5 / bNorm,(Vector *)&p_.Cmp);
          pVVar3 = Add_VV((Vector *)&r_.Cmp,pVVar3);
          Asgn_VV((Vector *)&p_.Cmp,pVVar3);
          pVVar3 = Mul_SV(dVar5 / bNorm,(Vector *)&q.Cmp);
          pVVar3 = Add_VV((Vector *)&p.Cmp,pVVar3);
          Asgn_VV((Vector *)&q.Cmp,pVVar3);
        }
        pVVar3 = Mul_QV(A,(Vector *)&p_.Cmp);
        Asgn_VV((Vector *)&z.Cmp,pVVar3);
        dVar6 = Mul_VV((Vector *)&q.Cmp,(Vector *)&z.Cmp);
        dVar6 = dVar5 / dVar6;
        pVVar3 = Mul_SV(dVar6,(Vector *)&p_.Cmp);
        AddAsgn_VV(x,pVVar3);
        pVVar3 = Mul_SV(dVar6,(Vector *)&z.Cmp);
        SubAsgn_VV((Vector *)&r_.Cmp,pVVar3);
        pQVar4 = Transp_Q(A);
        pVVar3 = Mul_QV(pQVar4,(Vector *)&q.Cmp);
        pVVar3 = Mul_SV(dVar6,pVVar3);
        SubAsgn_VV((Vector *)&p.Cmp,pVVar3);
        bNorm = dVar5;
      }
    }
    else {
      Asgn_VV((Vector *)&p.Cmp,(Vector *)&r_.Cmp);
      while( true ) {
        dVar5 = l2Norm_V((Vector *)&r_.Cmp);
        BVar1 = RTCResult(Alpha._4_4_,dVar5,bNorm_00,BiCGIterId);
        if (BVar1 != False || MaxIter <= Alpha._4_4_) break;
        Alpha._4_4_ = Alpha._4_4_ + 1;
        if (PrecondProc == (PrecondProcType)0x0) {
          Asgn_VV((Vector *)&z_.Cmp,(Vector *)&r_.Cmp);
        }
        else {
          (*PrecondProc)(A,(Vector *)&z_.Cmp,(Vector *)&r_.Cmp,OmegaPrecond);
        }
        BVar1 = Q_KerDefined(A);
        if (BVar1 != False) {
          OrthoRightKer_VQ((Vector *)&z_.Cmp,A);
        }
        if (PrecondProc == (PrecondProcType)0x0) {
          Asgn_VV((Vector *)local_1c0,(Vector *)&p.Cmp);
        }
        else {
          pQVar4 = Transp_Q(A);
          (*PrecondProc)(pQVar4,(Vector *)local_1c0,(Vector *)&p.Cmp,OmegaPrecond);
        }
        BVar1 = Q_KerDefined(A);
        if (BVar1 != False) {
          pQVar4 = Transp_Q(A);
          OrthoRightKer_VQ((Vector *)local_1c0,pQVar4);
        }
        dVar5 = Mul_VV((Vector *)&z_.Cmp,(Vector *)&p.Cmp);
        if (ABS(dVar5) < 2.2250738585072014e-307) {
          LASError(LASBreakdownErr,"BiCGIter","Rho",(char *)0x0,(char *)0x0);
          break;
        }
        if (Alpha._4_4_ == 1) {
          Asgn_VV((Vector *)&p_.Cmp,(Vector *)&z_.Cmp);
          Asgn_VV((Vector *)&q.Cmp,(Vector *)local_1c0);
        }
        else {
          pVVar3 = Mul_SV(dVar5 / bNorm,(Vector *)&p_.Cmp);
          pVVar3 = Add_VV((Vector *)&z_.Cmp,pVVar3);
          Asgn_VV((Vector *)&p_.Cmp,pVVar3);
          pVVar3 = Mul_SV(dVar5 / bNorm,(Vector *)&q.Cmp);
          pVVar3 = Add_VV((Vector *)local_1c0,pVVar3);
          Asgn_VV((Vector *)&q.Cmp,pVVar3);
        }
        pVVar3 = Mul_QV(A,(Vector *)&p_.Cmp);
        Asgn_VV((Vector *)&z.Cmp,pVVar3);
        dVar6 = Mul_VV((Vector *)&q.Cmp,(Vector *)&z.Cmp);
        dVar6 = dVar5 / dVar6;
        pVVar3 = Mul_SV(dVar6,(Vector *)&p_.Cmp);
        AddAsgn_VV(x,pVVar3);
        pVVar3 = Mul_SV(dVar6,(Vector *)&z.Cmp);
        SubAsgn_VV((Vector *)&r_.Cmp,pVVar3);
        pQVar4 = Transp_Q(A);
        pVVar3 = Mul_QV(pQVar4,(Vector *)&q.Cmp);
        pVVar3 = Mul_SV(dVar6,pVVar3);
        SubAsgn_VV((Vector *)&p.Cmp,pVVar3);
        bNorm = dVar5;
      }
    }
    BVar1 = Q_KerDefined(A);
    if (BVar1 != False) {
      OrthoRightKer_VQ(x,A);
    }
  }
  V_Destr((Vector *)&r_.Cmp);
  V_Destr((Vector *)&p.Cmp);
  V_Destr((Vector *)&p_.Cmp);
  V_Destr((Vector *)&q.Cmp);
  V_Destr((Vector *)&z.Cmp);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar1 = Q_KerDefined(A), BVar1 != False)) {
    V_Destr((Vector *)&z_.Cmp);
    V_Destr((Vector *)local_1c0);
  }
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *BiCGIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     */

    int Iter;
    double Alpha, Beta, Rho, RhoOld = 0.0;
    double bNorm;
    size_t Dim;
    Vector r, r_, p, p_, q, z, z_;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&r_, "r_", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    V_Constr(&p_, "p_", Dim, Normal, True);
    V_Constr(&q, "q", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A)) {
        V_Constr(&z, "z", Dim, Normal, True);
        V_Constr(&z_, "z_", Dim, Normal, True);
    }

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned BiCG */
            Asgn_VV(&r_, &r);
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, BiCGIterId)
                && Iter < MaxIter) {
                Iter++;
		if (PrecondProc != NULL)
                    (*PrecondProc)(A, &z, &r, OmegaPrecond);
		else
		    Asgn_VV(&z, &r);
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&z, A);
		if (PrecondProc != NULL)
                    (*PrecondProc)(Transp_Q(A), &z_, &r_, OmegaPrecond);
		else
		    Asgn_VV(&z_, &r_);
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&z_, Transp_Q(A));
                Rho = Mul_VV(&z, &r_);
                if (IsZero(Rho)){
                    LASError(LASBreakdownErr, "BiCGIter", "Rho", NULL, NULL);
                    break;
                }
                if (Iter == 1) {
                    Asgn_VV(&p, &z);
                    Asgn_VV(&p_, &z_);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&z, Mul_SV(Beta, &p)));
                    Asgn_VV(&p_, Add_VV(&z_, Mul_SV(Beta, &p_)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&p_, &q);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                SubAsgn_VV(&r_, Mul_SV(Alpha, Mul_QV(Transp_Q(A), &p_)));
                RhoOld = Rho;
            }
        } else {
            /* plain BiCG (z = r, z_ = r_) */
            Asgn_VV(&r_, &r);
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, BiCGIterId)
                && Iter < MaxIter) {
                Iter++;
                Rho = Mul_VV(&r, &r_);
                if (IsZero(Rho)) {
                    LASError(LASBreakdownErr, "BiCGIter", "Rho", NULL, NULL);
                    break;
                }
                if (Iter == 1) {
                    Asgn_VV(&p, &r);
                    Asgn_VV(&p_, &r_);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&r, Mul_SV(Beta, &p)));
                    Asgn_VV(&p_, Add_VV(&r_, Mul_SV(Beta, &p_)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&p_, &q);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                SubAsgn_VV(&r_, Mul_SV(Alpha, Mul_QV(Transp_Q(A), &p_)));
                RhoOld = Rho;
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }

    V_Destr(&r);
    V_Destr(&r_);
    V_Destr(&p);
    V_Destr(&p_);
    V_Destr(&q);
    if (PrecondProc != NULL || Q_KerDefined(A)) {
        V_Destr(&z);
        V_Destr(&z_);
    }

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}